

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hydro_godunov_extrap_vel_to_faces_3D.cpp
# Opt level: O3

void Godunov::ExtrapVelToFaces
               (MultiFab *a_vel,MultiFab *a_forces,MultiFab *a_umac,MultiFab *a_vmac,
               MultiFab *a_wmac,Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *h_bcrec,
               BCRec *d_bcrec,Geometry *geom,Real l_dt,bool use_ppm,bool use_forces_in_trans)

{
  int iVar1;
  Real *p;
  Geometry geom_00;
  int iVar2;
  int iVar3;
  int iVar4;
  Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *h_bcrec_00;
  int iVar5;
  long lVar6;
  int iVar7;
  int iVar8;
  Geometry *pGVar9;
  undefined8 *puVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  byte bVar16;
  undefined1 in_stack_fffffffffffff7a0 [64];
  undefined8 in_stack_fffffffffffff7e0;
  Array4<double> *in_stack_fffffffffffff7e8;
  Array4<double> *in_stack_fffffffffffff7f0;
  Array4<const_double> *in_stack_fffffffffffff7f8;
  Array4<const_double> *in_stack_fffffffffffff800;
  Array4<const_double> *in_stack_fffffffffffff808;
  Array4<const_double> *in_stack_fffffffffffff810;
  Array4<double> *in_stack_fffffffffffff818;
  Array4<double> *in_stack_fffffffffffff820;
  Array4<double> *in_stack_fffffffffffff828;
  Array4<double> *in_stack_fffffffffffff830;
  Array4<double> *in_stack_fffffffffffff838;
  Array4<double> *in_stack_fffffffffffff840;
  Array4<const_double> *in_stack_fffffffffffff848;
  Box *in_stack_fffffffffffff850;
  Real *in_stack_fffffffffffff858;
  BCRec *in_stack_fffffffffffff860;
  Array4<const_double> local_748;
  Box result;
  Box local_6d4;
  ulong local_6b8;
  ulong local_6b0;
  ulong local_6a8;
  Box local_69c;
  Box local_680;
  Box local_664;
  Array4<double> local_648;
  Array4<double> local_608;
  Array4<double> local_5c8;
  Array4<double> local_588;
  Array4<double> local_548;
  Array4<double> local_508;
  Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *local_4c8;
  ulong local_4c0;
  Real *local_4b8;
  Box *local_4b0;
  FabArray<amrex::FArrayBox> *local_4a8;
  FabArray<amrex::FArrayBox> *local_4a0;
  FabArray<amrex::FArrayBox> *local_498;
  FabArray<amrex::FArrayBox> *local_490;
  FabArray<amrex::FArrayBox> *local_488;
  long local_480;
  double *local_478;
  Array4<double> local_470;
  Array4<double> local_430;
  Array4<double> local_3f0;
  Array4<const_double> local_3b0;
  Array4<const_double> local_370;
  Array4<const_double> local_330;
  Array4<const_double> local_2f0;
  Array4<const_double> local_2b0;
  MFIter mfi;
  Box local_20c;
  Box local_1f0;
  Box local_1d4;
  FArrayBox scratch;
  Array4<const_double> local_170;
  Array4<const_double> local_130;
  Array4<double> local_f0;
  Array4<double> local_b0;
  Array4<double> local_70;
  
  bVar16 = 0;
  local_4c8 = h_bcrec;
  local_4a0 = &a_forces->super_FabArray<amrex::FArrayBox>;
  local_498 = &a_umac->super_FabArray<amrex::FArrayBox>;
  local_490 = &a_vmac->super_FabArray<amrex::FArrayBox>;
  local_488 = &a_wmac->super_FabArray<amrex::FArrayBox>;
  amrex::FArrayBox::FArrayBox(&scratch);
  local_4a8 = &a_vel->super_FabArray<amrex::FArrayBox>;
  amrex::MFIter::MFIter(&mfi,(FabArrayBase *)a_vel,true);
  if (mfi.currentIndex < mfi.endIndex) {
    local_4b0 = &geom->domain;
    local_4b8 = (geom->super_CoordSys).dx;
    do {
      amrex::MFIter::tilebox(&local_6d4,&mfi);
      result.smallend.vect[2] = local_6d4.smallend.vect[2] + -1;
      result.bigend.vect[0] = local_6d4.bigend.vect[0] + 1;
      result.smallend.vect[1] = local_6d4.smallend.vect[1] - 1;
      result.smallend.vect[0] = local_6d4.smallend.vect[0] + -1;
      result.bigend.vect[1] = local_6d4.bigend.vect[1] + 1;
      result.bigend.vect[2] = local_6d4.bigend.vect[2] + 1;
      amrex::MFIter::nodaltilebox(&local_1d4,&mfi,0);
      amrex::MFIter::nodaltilebox(&local_1f0,&mfi,1);
      amrex::MFIter::nodaltilebox(&local_20c,&mfi,2);
      amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>(&local_70,local_498,&mfi);
      amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>(&local_b0,local_490,&mfi);
      amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>(&local_f0,local_488,&mfi);
      amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>(&local_130,local_4a8,&mfi)
      ;
      amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>(&local_170,local_4a0,&mfi)
      ;
      amrex::FArrayBox::resize(&scratch,&result,0x27,(Arena *)0x0);
      h_bcrec_00 = local_4c8;
      iVar4 = local_6d4.bigend.vect[2];
      iVar5 = local_6d4.bigend.vect[1];
      iVar3 = local_6d4.smallend.vect[2];
      iVar2 = local_6d4.smallend.vect[0];
      local_508.p = scratch.super_BaseFab<double>.dptr;
      local_648.jstride = ((long)result.bigend.vect[0] - (long)result.smallend.vect[0]) + 1;
      local_648.kstride =
           (((long)result.bigend.vect[1] + 1) - (long)result.smallend.vect[1]) * local_648.jstride;
      local_648.nstride =
           (((long)result.bigend.vect[2] + 1) - (long)result.smallend.vect[2]) * local_648.kstride;
      local_508.begin.x = result.smallend.vect[0];
      local_508.begin.y = result.smallend.vect[1];
      local_508.begin.z = result.smallend.vect[2];
      local_648.end._0_8_ =
           (ulong)(result.bigend.vect[0] + 1) | (long)result.bigend.vect[1] + 1 << 0x20;
      local_648.end.z = (int)((long)result.bigend.vect[2] + 1);
      local_548.p = scratch.super_BaseFab<double>.dptr + local_648.nstride * 3;
      local_548.begin.x = result.smallend.vect[0];
      local_548.begin.y = result.smallend.vect[1];
      local_548.begin.z = result.smallend.vect[2];
      local_588.p = local_548.p + local_648.nstride * 3;
      local_588.begin.x = result.smallend.vect[0];
      local_588.begin.y = result.smallend.vect[1];
      local_588.begin.z = result.smallend.vect[2];
      local_5c8.p = local_588.p + local_648.nstride * 3;
      local_5c8.begin.x = result.smallend.vect[0];
      local_5c8.begin.y = result.smallend.vect[1];
      local_5c8.begin.z = result.smallend.vect[2];
      local_608.p = local_5c8.p + local_648.nstride * 3;
      local_608.begin.x = result.smallend.vect[0];
      local_608.begin.y = result.smallend.vect[1];
      local_608.begin.z = result.smallend.vect[2];
      local_648.p = local_608.p + local_648.nstride * 3;
      local_648.begin.x = result.smallend.vect[0];
      local_648.begin.y = result.smallend.vect[1];
      local_648.begin.z = result.smallend.vect[2];
      local_3f0.p = local_648.p + local_648.nstride * 3;
      local_6a8 = (ulong)(uint)local_6d4.smallend.vect[1];
      local_6b0 = (ulong)(uint)local_6d4.bigend.vect[0];
      iVar12 = local_6d4.smallend.vect[1] - 1;
      iVar7 = local_6d4.smallend.vect[2] + -1;
      iVar11 = local_6d4.bigend.vect[0] - (local_6d4.btype.itype | 0xfffffffe);
      iVar1 = local_6d4.bigend.vect[1] + 2;
      local_3f0.jstride = (Long)(iVar11 - local_6d4.smallend.vect[0]);
      local_3f0.kstride = local_3f0.jstride * (iVar1 - iVar12);
      local_430.end.z = local_6d4.bigend.vect[2] + 2;
      local_3f0.nstride = local_3f0.kstride * (local_430.end.z - iVar7);
      local_3f0.begin.y = iVar12;
      local_3f0.begin.x = local_6d4.smallend.vect[0];
      local_3f0.end.y = iVar1;
      local_3f0.end.x = iVar11;
      local_430.p = local_3f0.p + local_3f0.nstride;
      iVar14 = local_6d4.bigend.vect[1] - (local_6d4.btype.itype >> 1 | 0xfffffffe);
      iVar13 = local_6d4.bigend.vect[0] + 2;
      local_430.end.y = iVar14;
      local_430.end.x = iVar13;
      local_470.end.y = iVar1;
      local_470.end.x = iVar13;
      iVar15 = local_6d4.smallend.vect[0] + -1;
      local_470.jstride = (Long)(iVar13 - iVar15);
      local_430.kstride = (iVar14 - local_6d4.smallend.vect[1]) * local_470.jstride;
      local_430.nstride = local_430.kstride * (local_430.end.z - iVar7);
      local_430.begin.y = local_6d4.smallend.vect[1];
      local_430.begin.x = iVar15;
      local_478 = local_430.p + local_430.nstride;
      iVar13 = local_6d4.bigend.vect[2] - (local_6d4.btype.itype >> 2 | 0xfffffffe);
      local_470.kstride = (iVar1 - iVar12) * local_470.jstride;
      local_480 = (iVar13 - local_6d4.smallend.vect[2]) * local_470.kstride;
      local_470.begin.y = iVar12;
      local_470.begin.x = iVar15;
      local_470.begin.z = local_6d4.smallend.vect[2];
      local_508.ncomp = 3;
      local_548.ncomp = 3;
      local_588.ncomp = 3;
      local_5c8.ncomp = 3;
      local_608.ncomp = 3;
      local_648.ncomp = 3;
      local_3f0.ncomp = 1;
      local_430.ncomp = 1;
      local_470.ncomp = 1;
      local_608.jstride = local_648.jstride;
      local_608.kstride = local_648.kstride;
      local_608.nstride = local_648.nstride;
      local_608.end._0_8_ = local_648.end._0_8_;
      local_608.end.z = local_648.end.z;
      local_5c8.jstride = local_648.jstride;
      local_5c8.kstride = local_648.kstride;
      local_5c8.nstride = local_648.nstride;
      local_5c8.end._0_8_ = local_648.end._0_8_;
      local_5c8.end.z = local_648.end.z;
      local_588.jstride = local_648.jstride;
      local_588.kstride = local_648.kstride;
      local_588.nstride = local_648.nstride;
      local_588.end._0_8_ = local_648.end._0_8_;
      local_588.end.z = local_648.end.z;
      local_548.jstride = local_648.jstride;
      local_548.kstride = local_648.kstride;
      local_548.nstride = local_648.nstride;
      local_548.end._0_8_ = local_648.end._0_8_;
      local_548.end.z = local_648.end.z;
      local_508.jstride = local_648.jstride;
      local_508.kstride = local_648.kstride;
      local_508.nstride = local_648.nstride;
      local_508.end._0_8_ = local_648.end._0_8_;
      local_508.end.z = local_648.end.z;
      local_470.p = local_478;
      local_470.nstride = local_480;
      local_470.end.z = iVar13;
      local_430.jstride = local_470.jstride;
      local_430.begin.z = iVar7;
      local_3f0.begin.z = iVar7;
      local_3f0.end.z = local_430.end.z;
      if (use_ppm) {
        pGVar9 = geom;
        puVar10 = (undefined8 *)&stack0xfffffffffffff7a0;
        for (lVar6 = 0x19; lVar6 != 0; lVar6 = lVar6 + -1) {
          *puVar10 = *(undefined8 *)&pGVar9->super_CoordSys;
          pGVar9 = (Geometry *)((long)pGVar9 + (ulong)bVar16 * -0x10 + 8);
          puVar10 = puVar10 + (ulong)bVar16 * -2 + 1;
        }
        geom_00.super_CoordSys.inv_dx[1] = (Real)in_stack_fffffffffffff7e0;
        geom_00.super_CoordSys.c_sys = in_stack_fffffffffffff7a0._0_4_;
        geom_00.super_CoordSys._4_4_ = in_stack_fffffffffffff7a0._4_4_;
        geom_00.super_CoordSys.offset[0] = (Real)in_stack_fffffffffffff7a0._8_8_;
        geom_00.super_CoordSys.offset[1] = (Real)in_stack_fffffffffffff7a0._16_8_;
        geom_00.super_CoordSys.offset[2] = (Real)in_stack_fffffffffffff7a0._24_8_;
        geom_00.super_CoordSys.dx[0] = (Real)in_stack_fffffffffffff7a0._32_8_;
        geom_00.super_CoordSys.dx[1] = (Real)in_stack_fffffffffffff7a0._40_8_;
        geom_00.super_CoordSys.dx[2] = (Real)in_stack_fffffffffffff7a0._48_8_;
        geom_00.super_CoordSys.inv_dx[0] = (Real)in_stack_fffffffffffff7a0._56_8_;
        geom_00.super_CoordSys.inv_dx[2] = (Real)in_stack_fffffffffffff7e8;
        geom_00.super_CoordSys._80_8_ = in_stack_fffffffffffff7f0;
        geom_00.prob_domain.xlo[0] = (Real)in_stack_fffffffffffff7f8;
        geom_00.prob_domain.xlo[1] = (Real)in_stack_fffffffffffff800;
        geom_00.prob_domain.xlo[2] = (Real)in_stack_fffffffffffff808;
        geom_00.prob_domain.xhi[0] = (Real)in_stack_fffffffffffff810;
        geom_00.prob_domain.xhi[1] = (Real)in_stack_fffffffffffff818;
        geom_00.prob_domain.xhi[2] = (Real)in_stack_fffffffffffff820;
        geom_00.roundoff_hi_d.arr[0] = (double)in_stack_fffffffffffff828;
        geom_00.roundoff_hi_d.arr[1] = (double)in_stack_fffffffffffff830;
        geom_00.roundoff_hi_d.arr[2] = (double)in_stack_fffffffffffff838;
        geom_00.roundoff_hi_f.arr._0_8_ = in_stack_fffffffffffff840;
        geom_00._168_8_ = in_stack_fffffffffffff848;
        geom_00.domain.smallend.vect._4_8_ = in_stack_fffffffffffff850;
        geom_00.domain.bigend.vect._0_8_ = in_stack_fffffffffffff858;
        geom_00.domain._20_8_ = in_stack_fffffffffffff860;
        PPM::PredictVelOnFaces
                  (&result,&local_508,&local_588,&local_608,&local_548,&local_5c8,&local_648,
                   &local_130,&local_130,geom_00,l_dt,d_bcrec);
        local_664.bigend.vect[0] = iVar11 + -1;
        local_69c.bigend.vect[1] = iVar5 + 1;
        iVar5 = (int)local_6b0 + 1;
      }
      else {
        local_748.p = (double *)CONCAT44(iVar12,local_6d4.smallend.vect[0]);
        local_4c0 = (ulong)(iVar11 - 1U);
        local_6b8 = (ulong)(local_6d4.bigend.vect[1] + 1U);
        iVar8 = local_6d4.bigend.vect[2] + 1;
        local_748.jstride = CONCAT44(iVar11 - 1U,iVar7);
        local_748.kstride = CONCAT44(iVar8,local_6d4.bigend.vect[1] + 1U);
        local_748.nstride = local_748.nstride & 0xffffffff00000000;
        PLM::PredictVelOnXFace
                  ((Box *)&local_748,3,&local_508,&local_548,&local_130,&local_130,geom,l_dt,
                   local_4c8,d_bcrec);
        local_748.p = (double *)CONCAT44((int)local_6a8,iVar15);
        iVar1 = (int)local_6b0;
        iVar5 = iVar1 + 1;
        local_748.jstride = CONCAT44(iVar5,iVar7);
        local_748.kstride = CONCAT44(iVar8,iVar14 + -1);
        local_748.nstride = local_748.nstride & 0xffffffff00000000;
        PLM::PredictVelOnYFace
                  ((Box *)&local_748,3,&local_588,&local_5c8,&local_130,&local_130,geom,l_dt,
                   h_bcrec_00,d_bcrec);
        local_748.p = (double *)CONCAT44(iVar12,iVar15);
        local_748.jstride = CONCAT44(iVar1 + 1,iVar3);
        local_748.kstride = CONCAT44(iVar13 + -1,(int)local_6b8);
        local_748.nstride = local_748.nstride & 0xffffffff00000000;
        PLM::PredictVelOnZFace
                  ((Box *)&local_748,3,&local_608,&local_648,&local_130,&local_130,geom,l_dt,
                   h_bcrec_00,d_bcrec);
        local_69c.bigend.vect[1] = (int)local_6b8;
        local_664.bigend.vect[0] = (int)local_4c0;
      }
      in_stack_fffffffffffff850 = local_4b0;
      local_680.bigend.vect[2] = iVar4 + 1;
      local_680.bigend.vect[1] = iVar14 + -1;
      local_69c.bigend.vect[2] = iVar13 + -1;
      in_stack_fffffffffffff7f8 = &local_130;
      p = local_478 + local_480;
      local_664.smallend.vect[0] = iVar2;
      local_680.smallend.vect[1] = (int)local_6a8;
      local_69c.smallend.vect[2] = iVar3;
      local_748.p = local_508.p;
      local_748.jstride = local_508.jstride;
      local_748.kstride = local_508.kstride;
      local_748.nstride = local_508.nstride;
      local_748.begin.z = local_508.begin.z;
      local_748.begin.x = local_508.begin.x;
      local_748.begin.y = local_508.begin.y;
      local_748.end.z = local_508.end.z;
      local_748.end.x = local_508.end.x;
      local_748.end.y = local_508.end.y;
      local_748.ncomp = local_508.ncomp;
      local_370.p = local_588.p;
      local_370.jstride = local_588.jstride;
      local_370.kstride = local_588.kstride;
      local_370.nstride = local_588.nstride;
      local_370.begin.z = local_588.begin.z;
      local_370.begin.x = local_588.begin.x;
      local_370.begin.y = local_588.begin.y;
      local_370.end.z = local_588.end.z;
      local_370.end.x = local_588.end.x;
      local_370.end.y = local_588.end.y;
      local_370.ncomp = local_588.ncomp;
      local_3b0.p = local_608.p;
      local_3b0.jstride = local_608.jstride;
      local_3b0.kstride = local_608.kstride;
      local_3b0.nstride = local_608.nstride;
      local_3b0.begin.z = local_608.begin.z;
      local_3b0.begin.x = local_608.begin.x;
      local_3b0.begin.y = local_608.begin.y;
      local_3b0.end.z = local_608.end.z;
      local_3b0.end.x = local_608.end.x;
      local_3b0.end.y = local_608.end.y;
      local_3b0.ncomp = local_608.ncomp;
      local_2b0.p = local_548.p;
      local_2b0.jstride = local_548.jstride;
      local_2b0.kstride = local_548.kstride;
      local_2b0.nstride = local_548.nstride;
      local_2b0.begin.z = local_548.begin.z;
      local_2b0.begin.x = local_548.begin.x;
      local_2b0.begin.y = local_548.begin.y;
      local_2b0.end.z = local_548.end.z;
      local_2b0.end.x = local_548.end.x;
      local_2b0.end.y = local_548.end.y;
      local_2b0.ncomp = local_548.ncomp;
      local_2f0.p = local_5c8.p;
      local_2f0.jstride = local_5c8.jstride;
      local_2f0.kstride = local_5c8.kstride;
      local_2f0.nstride = local_5c8.nstride;
      local_2f0.begin.z = local_5c8.begin.z;
      local_2f0.begin.x = local_5c8.begin.x;
      local_2f0.begin.y = local_5c8.begin.y;
      local_2f0.end.z = local_5c8.end.z;
      local_2f0.end.x = local_5c8.end.x;
      local_2f0.end.y = local_5c8.end.y;
      local_2f0.ncomp = local_5c8.ncomp;
      local_330.p = local_648.p;
      local_330.jstride = local_648.jstride;
      local_330.kstride = local_648.kstride;
      local_330.nstride = local_648.nstride;
      local_330.begin.z = local_648.begin.z;
      local_330.begin.x = local_648.begin.x;
      local_330.begin.y = local_648.begin.y;
      local_330.end.z = local_648.end.z;
      local_330.end.x = local_648.end.x;
      local_330.end.y = local_648.end.y;
      local_330.ncomp = local_648.ncomp;
      local_664.btype.itype = 0;
      local_680.btype.itype = 0;
      local_69c.btype.itype = 0;
      local_69c.smallend.vect[0] = iVar15;
      local_69c.smallend.vect[1] = iVar12;
      local_69c.bigend.vect[0] = iVar5;
      local_680.smallend.vect[0] = iVar15;
      local_680.smallend.vect[2] = iVar7;
      local_680.bigend.vect[0] = iVar5;
      local_664.smallend.vect[1] = iVar12;
      local_664.smallend.vect[2] = iVar7;
      local_664.bigend.vect[1] = local_69c.bigend.vect[1];
      local_664.bigend.vect[2] = local_680.bigend.vect[2];
      ComputeAdvectiveVel(&local_664,&local_680,&local_69c,&local_3f0,&local_430,&local_470,
                          &local_748,&local_370,&local_3b0,&local_2b0,&local_2f0,&local_330,
                          in_stack_fffffffffffff7f8,&local_170,local_4b0,l_dt,d_bcrec,
                          use_forces_in_trans);
      local_748.p = local_3f0.p;
      local_748.jstride = local_3f0.jstride;
      local_748.kstride = local_3f0.kstride;
      local_748.nstride = local_3f0.nstride;
      local_748.begin.z = local_3f0.begin.z;
      local_748.begin.x = local_3f0.begin.x;
      local_748.begin.y = local_3f0.begin.y;
      local_748.end.z = local_3f0.end.z;
      local_748.end.x = local_3f0.end.x;
      local_748.end.y = local_3f0.end.y;
      local_748.ncomp = local_3f0.ncomp;
      local_370.p = local_430.p;
      local_370.jstride = local_430.jstride;
      local_370.kstride = local_430.kstride;
      local_370.nstride = local_430.nstride;
      local_370.begin.z = local_430.begin.z;
      local_370.begin.x = local_430.begin.x;
      local_370.begin.y = local_430.begin.y;
      local_370.end.z = local_430.end.z;
      local_370.end.x = local_430.end.x;
      local_370.end.y = local_430.end.y;
      local_370.ncomp = local_430.ncomp;
      local_3b0.p = local_470.p;
      local_3b0.jstride = local_470.jstride;
      local_3b0.kstride = local_470.kstride;
      local_3b0.nstride = local_470.nstride;
      local_3b0.begin.z = local_470.begin.z;
      local_3b0.begin.x = local_470.begin.x;
      local_3b0.begin.y = local_470.begin.y;
      local_3b0.end.z = local_470.end.z;
      local_3b0.end.x = local_470.end.x;
      local_3b0.end.y = local_470.end.y;
      local_3b0.ncomp = local_470.ncomp;
      in_stack_fffffffffffff848 = &local_170;
      in_stack_fffffffffffff840 = &local_648;
      in_stack_fffffffffffff838 = &local_5c8;
      in_stack_fffffffffffff830 = &local_548;
      in_stack_fffffffffffff828 = &local_608;
      in_stack_fffffffffffff820 = &local_588;
      in_stack_fffffffffffff818 = &local_508;
      in_stack_fffffffffffff810 = &local_3b0;
      in_stack_fffffffffffff808 = &local_370;
      in_stack_fffffffffffff800 = &local_748;
      in_stack_fffffffffffff7f0 = &local_f0;
      in_stack_fffffffffffff7e8 = &local_b0;
      in_stack_fffffffffffff7e0 = 0x2ae4ca;
      in_stack_fffffffffffff858 = local_4b8;
      in_stack_fffffffffffff860 = d_bcrec;
      ExtrapVelToFacesOnBox
                (&local_6d4,3,&local_1d4,&local_1f0,&local_20c,&local_70,in_stack_fffffffffffff7e8,
                 in_stack_fffffffffffff7f0,in_stack_fffffffffffff7f8,in_stack_fffffffffffff800,
                 in_stack_fffffffffffff808,in_stack_fffffffffffff810,in_stack_fffffffffffff818,
                 in_stack_fffffffffffff820,in_stack_fffffffffffff828,in_stack_fffffffffffff830,
                 in_stack_fffffffffffff838,in_stack_fffffffffffff840,in_stack_fffffffffffff848,
                 in_stack_fffffffffffff850,local_4b8,l_dt,d_bcrec,use_forces_in_trans,p);
      amrex::Gpu::Device::streamSynchronize();
      amrex::MFIter::operator++(&mfi);
    } while (mfi.currentIndex < mfi.endIndex);
  }
  amrex::MFIter::~MFIter(&mfi);
  scratch.super_BaseFab<double>._vptr_BaseFab = (_func_int **)&PTR__BaseFab_00712bd8;
  amrex::BaseFab<double>::clear(&scratch.super_BaseFab<double>);
  return;
}

Assistant:

void
Godunov::ExtrapVelToFaces ( MultiFab const& a_vel,
                            MultiFab const& a_forces,
                            MultiFab& a_umac,
                            MultiFab& a_vmac,
                            MultiFab& a_wmac,
                            const Vector<BCRec> & h_bcrec,
                const        BCRec  * d_bcrec,
                            const Geometry& geom, Real l_dt,
                            bool use_ppm, bool use_forces_in_trans)
{
    Box const& domain = geom.Domain();
    const Real* dx    = geom.CellSize();

    const int ncomp = AMREX_SPACEDIM;
#ifdef _OPENMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
    {
        FArrayBox scratch;
        for (MFIter mfi(a_vel,TilingIfNotGPU()); mfi.isValid(); ++mfi)
        {
            Box const& bx = mfi.tilebox();
            Box const& bxg1 = amrex::grow(bx,1);

            Box const& xbx = mfi.nodaltilebox(0);
            Box const& ybx = mfi.nodaltilebox(1);
            Box const& zbx = mfi.nodaltilebox(2);

            Array4<Real> const& umac = a_umac.array(mfi);
            Array4<Real> const& vmac = a_vmac.array(mfi);
            Array4<Real> const& wmac = a_wmac.array(mfi);

            Array4<Real const> const& vel = a_vel.const_array(mfi);
            Array4<Real const> const& f   = a_forces.const_array(mfi);

            scratch.resize(bxg1, (ncomp*4 + 1)*AMREX_SPACEDIM);
            Real* p = scratch.dataPtr();

            Array4<Real> Imx = makeArray4(p,bxg1,ncomp);
            p +=         Imx.size();
            Array4<Real> Ipx = makeArray4(p,bxg1,ncomp);
            p +=         Ipx.size();
            Array4<Real> Imy = makeArray4(p,bxg1,ncomp);
            p +=         Imy.size();
            Array4<Real> Ipy = makeArray4(p,bxg1,ncomp);
            p +=         Ipy.size();
            Array4<Real> Imz = makeArray4(p,bxg1,ncomp);
            p +=         Imz.size();
            Array4<Real> Ipz = makeArray4(p,bxg1,ncomp);
            p +=         Ipz.size();
            Array4<Real> u_ad = makeArray4(p,Box(bx).grow(1,1).grow(2,1).surroundingNodes(0),1);
            p +=         u_ad.size();
            Array4<Real> v_ad = makeArray4(p,Box(bx).grow(0,1).grow(2,1).surroundingNodes(1),1);
            p +=         v_ad.size();
            Array4<Real> w_ad = makeArray4(p,Box(bx).grow(0,1).grow(1,1).surroundingNodes(2),1);
            p +=         w_ad.size();

            if (use_ppm)
            {
                PPM::PredictVelOnFaces( bxg1,
                                        Imx, Imy, Imz, Ipx, Ipy, Ipz,
                                        vel, vel,
                                        geom, l_dt, d_bcrec);
            }
            else
            {
                PLM::PredictVelOnXFace( Box(u_ad), AMREX_SPACEDIM, Imx, Ipx, vel, vel,
                                         geom, l_dt, h_bcrec, d_bcrec);
                PLM::PredictVelOnYFace( Box(v_ad), AMREX_SPACEDIM, Imy, Ipy, vel, vel,
                                        geom, l_dt, h_bcrec, d_bcrec);
                PLM::PredictVelOnZFace( Box(w_ad), AMREX_SPACEDIM, Imz, Ipz, vel, vel,
                                        geom, l_dt, h_bcrec, d_bcrec);
            }

            ComputeAdvectiveVel( Box(u_ad), Box(v_ad), Box(w_ad),
                                 u_ad, v_ad, w_ad,
                                 Imx, Imy, Imz, Ipx, Ipy, Ipz,
                                 vel, f, domain, l_dt, d_bcrec, use_forces_in_trans);

            ExtrapVelToFacesOnBox( bx, ncomp,
                                   xbx, ybx, zbx,
                                   umac, vmac, wmac, vel,
                                   u_ad, v_ad, w_ad,
                                   Imx, Imy, Imz, Ipx, Ipy, Ipz,
                                   f, domain, dx, l_dt, d_bcrec, use_forces_in_trans, p);

            Gpu::streamSynchronize();  // otherwise we might be using too much memory
        }
    }
}